

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

DescriptorFlags __thiscall
Js::SimpleTypeHandler<2UL>::GetSetter
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,PropertyId propertyId,
          Var *setterValue,PropertyValueInfo *info,ScriptContext *requestContext)

{
  byte bVar1;
  BOOL BVar2;
  DescriptorFlags DVar3;
  uint uVar4;
  uint uVar5;
  uint32 local_2c [2];
  uint32 indexVal;
  
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = &instance->super_RecyclableObject;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
  }
  if (0 < this->propertyCount) {
    uVar4 = 1;
    do {
      uVar5 = uVar4 - 1 & 0xffff;
      if (*(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + (ulong)(uVar5 << 4)) + 8) ==
          propertyId) {
        bVar1 = *(byte *)((long)&this->descriptors[0].field_1 + (ulong)(uVar5 << 4));
        if ((bVar1 & 8) != 0) {
          return None;
        }
        return bVar1 & Writable | Data;
      }
      uVar5 = uVar4 & 0xffff;
      uVar4 = uVar4 + 1;
    } while (uVar5 < (uint)this->propertyCount);
  }
  BVar2 = ScriptContext::IsNumericPropertyId
                    ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr,propertyId,local_2c);
  if (BVar2 == 0) {
    DVar3 = None;
  }
  else {
    DVar3 = DynamicTypeHandler::GetItemSetter
                      (&this->super_DynamicTypeHandler,instance,local_2c[0],setterValue,
                       requestContext);
  }
  return DVar3;
}

Assistant:

DescriptorFlags SimpleTypeHandler<size>::GetSetter(DynamicObject* instance, PropertyId propertyId, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        PropertyIndex index;
        PropertyValueInfo::SetNoCache(info, instance);
        if (GetDescriptor(propertyId, &index))
        {
            if (descriptors[index].Attributes & PropertyDeleted)
            {
                return None;
            }
            return (descriptors[index].Attributes & PropertyWritable) ? WritableData : Data;
        }

        uint32 indexVal;
        if (instance->GetScriptContext()->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::GetItemSetter(instance, indexVal, setterValue, requestContext);
        }

        return None;
    }